

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDar.c
# Opt level: O0

int Abc_NtkDarPdr(Abc_Ntk_t *pNtk,Pdr_Par_t *pPars)

{
  int iVar1;
  uint uVar2;
  abctime aVar3;
  Aig_Man_t *pAig;
  abctime aVar4;
  Aig_Man_t *pMan;
  abctime clk;
  int RetValue;
  Pdr_Par_t *pPars_local;
  Abc_Ntk_t *pNtk_local;
  
  aVar3 = Abc_Clock();
  pAig = Abc_NtkToDar(pNtk,0,1);
  if (pAig == (Aig_Man_t *)0x0) {
    Abc_Print(1,"Converting network into AIG has failed.\n");
    pNtk_local._4_4_ = -1;
  }
  else {
    pNtk_local._4_4_ = Pdr_ManSolve(pAig,pPars);
    iVar1 = Saig_ManPoNum(pAig);
    pPars->nDropOuts = (iVar1 - pPars->nProveOuts) - pPars->nFailOuts;
    if (pPars->fSilent == 0) {
      if (pPars->fSolveAll == 0) {
        if (pNtk_local._4_4_ == 1) {
          Abc_Print(1,"Property proved.  ");
        }
        else if (pNtk_local._4_4_ == 0) {
          if (pAig->pSeqModel == (Abc_Cex_t *)0x0) {
            Abc_Print(1,"Abc_NtkDarPdr(): Counter-example is not available.\n");
          }
          else {
            Abc_Print(1,"Output %d of miter \"%s\" was asserted in frame %d.  ",
                      (ulong)(uint)pAig->pSeqModel->iPo,pNtk->pName,
                      (ulong)(uint)pAig->pSeqModel->iFrame);
            iVar1 = Saig_ManVerifyCex(pAig,pAig->pSeqModel);
            if (iVar1 == 0) {
              Abc_Print(1,"Abc_NtkDarPdr(): Counter-example verification has FAILED.\n");
            }
          }
        }
        else {
          if (pNtk_local._4_4_ != -1) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcDar.c"
                          ,0xbfe,"int Abc_NtkDarPdr(Abc_Ntk_t *, Pdr_Par_t *)");
          }
          Abc_Print(1,"Property UNDECIDED.  ");
        }
      }
      else {
        uVar2 = Saig_ManPoNum(pAig);
        Abc_Print(1,"Properties:  All = %d. Proved = %d. Disproved = %d. Undecided = %d.   ",
                  (ulong)uVar2,(ulong)(uint)pPars->nProveOuts,(ulong)(uint)pPars->nFailOuts,
                  (ulong)(uint)pPars->nDropOuts);
      }
      Abc_Print(1,"%s =","Time");
      aVar4 = Abc_Clock();
      Abc_Print(1,"%9.2f sec\n",((double)(aVar4 - aVar3) * 1.0) / 1000000.0);
    }
    if (pNtk->pSeqModel != (Abc_Cex_t *)0x0) {
      free(pNtk->pSeqModel);
      pNtk->pSeqModel = (Abc_Cex_t *)0x0;
    }
    pNtk->pSeqModel = pAig->pSeqModel;
    pAig->pSeqModel = (Abc_Cex_t *)0x0;
    if (pNtk->vSeqModelVec != (Vec_Ptr_t *)0x0) {
      Vec_PtrFreeFree(pNtk->vSeqModelVec);
    }
    pNtk->vSeqModelVec = pAig->vSeqModelVec;
    pAig->vSeqModelVec = (Vec_Ptr_t *)0x0;
    Aig_ManStop(pAig);
  }
  return pNtk_local._4_4_;
}

Assistant:

int Abc_NtkDarPdr( Abc_Ntk_t * pNtk, Pdr_Par_t * pPars )
{
    int RetValue = -1;
    abctime clk = Abc_Clock();
    Aig_Man_t * pMan;
    pMan = Abc_NtkToDar( pNtk, 0, 1 );
    if ( pMan == NULL )
    {
        Abc_Print( 1, "Converting network into AIG has failed.\n" );
        return -1;
    }
    RetValue = Pdr_ManSolve( pMan, pPars );
    pPars->nDropOuts = Saig_ManPoNum(pMan) - pPars->nProveOuts - pPars->nFailOuts;
    if ( !pPars->fSilent )
    {
        if ( pPars->fSolveAll )
            Abc_Print( 1, "Properties:  All = %d. Proved = %d. Disproved = %d. Undecided = %d.   ", 
                Saig_ManPoNum(pMan), pPars->nProveOuts, pPars->nFailOuts, pPars->nDropOuts );
        else if ( RetValue == 1 )
            Abc_Print( 1, "Property proved.  " );
        else 
        {
            if ( RetValue == 0 )
            {
                if ( pMan->pSeqModel == NULL )
                    Abc_Print( 1, "Abc_NtkDarPdr(): Counter-example is not available.\n" );
                else
                {
                    Abc_Print( 1, "Output %d of miter \"%s\" was asserted in frame %d.  ", pMan->pSeqModel->iPo, pNtk->pName, pMan->pSeqModel->iFrame );
                    if ( !Saig_ManVerifyCex( pMan, pMan->pSeqModel ) )
                        Abc_Print( 1, "Abc_NtkDarPdr(): Counter-example verification has FAILED.\n" );
                }
            }
            else if ( RetValue == -1 )
                Abc_Print( 1, "Property UNDECIDED.  " );
            else
                assert( 0 );
        }
        ABC_PRT( "Time", Abc_Clock() - clk );
/*
        Abc_Print( 1, "Status: " );
        if ( pPars->pOutMap )
        {
            int i;
            for ( i = 0; i < Saig_ManPoNum(pMan); i++ )
                if ( pPars->pOutMap[i] == 1 )
                    Abc_Print( 1, "%d=%s ", i, "unsat" );
                else if ( pPars->pOutMap[i] == 0 )
                    Abc_Print( 1, "%d=%s ", i, "sat" );
                else if ( pPars->pOutMap[i] < 0 )
                    Abc_Print( 1, "%d=%s ", i, "undec" );
                else assert( 0 );
        }
        Abc_Print( 1, "\n" );
*/
    }
    ABC_FREE( pNtk->pSeqModel );
    pNtk->pSeqModel = pMan->pSeqModel;
    pMan->pSeqModel = NULL;
    if ( pNtk->vSeqModelVec )
        Vec_PtrFreeFree( pNtk->vSeqModelVec );
    pNtk->vSeqModelVec = pMan->vSeqModelVec;
    pMan->vSeqModelVec = NULL;
    Aig_ManStop( pMan );
    return RetValue;
}